

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::DoPartialReusePage
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep,
          uint *expectFreeByteCount)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  RecyclerSweepManager *this_00;
  size_t sVar6;
  uint uVar7;
  
  bVar3 = RecyclerSweep::InPartialCollectMode(recyclerSweep);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x472,"(recyclerSweep.InPartialCollectMode())",
                       "recyclerSweep.InPartialCollectMode()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = GetExpectedFreeObjectCount(this);
  uVar1 = this->objectSize;
  uVar7 = (uint)uVar4 * (uint)uVar1;
  *expectFreeByteCount = uVar7;
  this_00 = RecyclerSweep::GetManager(recyclerSweep);
  sVar6 = RecyclerSweepManager::GetPartialCollectSmallHeapBlockReuseMinFreeBytes(this_00);
  return sVar6 <= uVar7 + uVar1;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::DoPartialReusePage(RecyclerSweep const& recyclerSweep, uint& expectFreeByteCount)
{
    // Partial GC page reuse heuristic

    Assert(recyclerSweep.InPartialCollectMode());
    expectFreeByteCount = GetExpectedFreeBytes();
    // PartialCollectSmallHeapBlockReuseMinFreeBytes is calculated by dwPageSize* efficacy. If efficacy is
    // high (== 1), and dwPageSize % objectSize != 0, all the pages in the bucket will be partial, and that
    // could increase in thread sweep time.
    // OTOH, if the object size is really large, the calculation below will reduce the chance for a page to be
    // partial. we might need to watch out for that.
    return (expectFreeByteCount + objectSize >= recyclerSweep.GetManager()->GetPartialCollectSmallHeapBlockReuseMinFreeBytes());
}